

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void on_close(uvtls_t *tls)

{
  *(undefined4 *)((long)tls->data + 0x18290) = 1;
  return;
}

Assistant:

static void on_close(uvtls_t* tls) {
  int i;
  server_t* server = (server_t*) tls->data;

  for (i = 0; i < MAX_SERVER_CLIENTS; ++i) {
    client_t* client = server->clients[i];
    if (client && !uvtls_is_closing(&client->tls)) {
      uvtls_close(&client->tls, on_client_close);
    }
  }
}